

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

RPCHelpMan * help(void)

{
  string name;
  string m_key_name;
  string m_key_name_00;
  string description;
  string description_00;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_01;
  RPCArgOptions opts;
  undefined1 auVar1 [24];
  pointer *ppRVar2;
  RPCHelpMan *in_RDI;
  long lVar3;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  undefined8 in_stack_fffffffffffffaf8;
  undefined8 in_stack_fffffffffffffb08;
  undefined8 in_stack_fffffffffffffb10;
  undefined8 in_stack_fffffffffffffb18;
  code *pcVar4;
  undefined8 in_stack_fffffffffffffb20;
  pointer in_stack_fffffffffffffb28;
  pointer pRVar5;
  pointer in_stack_fffffffffffffb30;
  pointer pRVar6;
  pointer in_stack_fffffffffffffb38;
  pointer pRVar7;
  undefined8 in_stack_fffffffffffffb40;
  pointer in_stack_fffffffffffffb48;
  pointer pRVar8;
  pointer in_stack_fffffffffffffb50;
  pointer pRVar9;
  pointer in_stack_fffffffffffffb58;
  pointer pRVar10;
  pointer in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffb78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb98 [16];
  undefined8 in_stack_fffffffffffffba8;
  undefined1 *puVar11;
  undefined8 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb8;
  undefined1 uVar12;
  undefined7 in_stack_fffffffffffffbb9;
  undefined8 in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbc8;
  undefined1 *puVar13;
  undefined8 in_stack_fffffffffffffbd0;
  undefined8 in_stack_fffffffffffffbd8;
  long *local_418 [2];
  long local_408 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_3f8;
  long *local_3d8 [2];
  long local_3c8 [2];
  long *local_3b8 [2];
  long local_3a8 [2];
  RPCResult local_398;
  RPCResult local_310;
  undefined1 local_288;
  undefined1 *local_280;
  undefined8 local_278;
  undefined1 local_270;
  undefined7 uStack_26f;
  undefined1 local_260 [32];
  long *local_240 [2];
  long local_230 [2];
  uint *local_220;
  undefined8 local_218;
  uint local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  undefined1 local_1a8;
  long *local_1a0 [2];
  long local_190 [2];
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"help","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"\nList all commands, or get help for a specified command.\n","");
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"command","");
  local_220 = &local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"all commands","");
  local_200._0_8_ = (long)&local_200 + 0x10;
  if (local_220 == &local_210) {
    local_200._24_4_ = uStack_208;
    local_200._28_4_ = uStack_204;
  }
  else {
    local_200._0_8_ = local_220;
  }
  local_200._8_8_ = local_218;
  local_218 = 0;
  local_210 = local_210 & 0xffffff00;
  local_1a8 = 1;
  local_240[0] = local_230;
  local_220 = &local_210;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_240,"The command to get help on","");
  local_288 = 0;
  local_278 = 0;
  local_270 = 0;
  local_260._0_8_ = (pointer)0x0;
  local_260._8_2_ = 0;
  local_260._10_6_ = 0;
  local_260._16_2_ = 0;
  local_260._18_8_ = 0;
  name._M_string_length = (size_type)in_RDI;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffaf8;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffffb08;
  name.field_2._8_8_ = in_stack_fffffffffffffb10;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffffb20;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffffb18;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_fffffffffffffb28;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_fffffffffffffb30;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffffb38;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffffb40;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffffb48;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffffb50;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffffb58;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffffb60;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffffb68;
  description_01.field_2 = in_stack_fffffffffffffb88;
  description_01._0_16_ = in_stack_fffffffffffffb78;
  opts.oneline_description._M_string_length = in_stack_fffffffffffffba8;
  opts.skip_type_check = (bool)in_stack_fffffffffffffb98[0];
  opts._1_7_ = in_stack_fffffffffffffb98._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb98._8_8_;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffffbb0;
  opts.oneline_description.field_2._M_local_buf[8] = in_stack_fffffffffffffbb8;
  opts.oneline_description.field_2._9_7_ = in_stack_fffffffffffffbb9;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffbc0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffbc8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffbd0;
  opts.hidden = (bool)(char)in_stack_fffffffffffffbd8;
  opts.also_positional = (bool)(char)((ulong)in_stack_fffffffffffffbd8 >> 8);
  opts._66_6_ = (int6)((ulong)in_stack_fffffffffffffbd8 >> 0x10);
  local_280 = &local_270;
  RPCArg::RPCArg(&local_180,name,(Type)local_1a0,fallback,description_01,opts);
  __l._M_len = 1;
  __l._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffb88,__l,
             (allocator_type *)&stack0xfffffffffffffb87);
  local_3b8[0] = local_3a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"");
  local_3d8[0] = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"The help text","");
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffaf8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffb08;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffb10;
  description._M_string_length = in_stack_fffffffffffffb20;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb18;
  description.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffb28;
  description.field_2._8_8_ = in_stack_fffffffffffffb30;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_fffffffffffffb40;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffffb38;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  RPCResult::RPCResult(&local_398,STR,m_key_name,description,inner,SUB81(local_3b8,0));
  ppRVar2 = (pointer *)
            ((long)&local_3f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
            0x10);
  local_3f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppRVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"");
  local_418[0] = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"");
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffaf8;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffffb08;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffffb10;
  auVar1._8_8_ = pRVar8;
  auVar1._0_8_ = in_stack_fffffffffffffb40;
  auVar1._16_8_ = 0;
  RPCResult::RPCResult
            (&local_310,ANY,m_key_name_00,
             (string)ZEXT1632(CONCAT88(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18)),
             (vector<RPCResult,_std::allocator<RPCResult>_>)(auVar1 << 0x40),SUB81(&local_3f8,0));
  __l_00._M_len = 2;
  __l_00._M_array = &local_398;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb68,__l_00,
             (allocator_type *)&stack0xfffffffffffffba7);
  puVar11 = &stack0xfffffffffffffbb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffba8,"");
  puVar13 = &stack0xfffffffffffffbd8;
  if (puVar11 != &stack0xfffffffffffffbb8) {
    puVar13 = puVar11;
  }
  lVar3 = CONCAT71(in_stack_fffffffffffffbb9,in_stack_fffffffffffffbb8);
  uVar12 = 0;
  pcVar4 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp:155:9)>
           ::_M_manager;
  description_00._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp:155:9)>
       ::_M_invoke;
  description_00._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp:155:9)>
                ::_M_manager;
  description_00.field_2._M_allocated_capacity = (size_type)pRVar5;
  description_00.field_2._8_8_ = pRVar6;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_fffffffffffffb40;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar7;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar8;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar10;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar9;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffb60;
  examples.m_examples.field_2 = in_stack_fffffffffffffb78;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb68._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffffb68._8_8_;
  puVar11 = &stack0xfffffffffffffbb8;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffffb08)),description_00,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar4 != (code *)0x0) {
    (*pcVar4)(&stack0xfffffffffffffb08,&stack0xfffffffffffffb08,3);
  }
  if (puVar13 != &stack0xfffffffffffffbd8) {
    operator_delete(puVar13,lVar3 + 1);
  }
  if (puVar11 != &stack0xfffffffffffffbb8) {
    operator_delete(puVar11,CONCAT71(in_stack_fffffffffffffbb9,uVar12) + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb68);
  lVar3 = 0x110;
  do {
    if ((long *)((long)local_3a8 + lVar3) != *(long **)((long)local_3b8 + lVar3)) {
      operator_delete(*(long **)((long)local_3b8 + lVar3),*(long *)((long)local_3a8 + lVar3) + 1);
    }
    if ((long *)((long)local_3c8 + lVar3) != *(long **)((long)local_3d8 + lVar3)) {
      operator_delete(*(long **)((long)local_3d8 + lVar3),*(long *)((long)local_3c8 + lVar3) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_3f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar3));
    if ((long *)((long)local_408 + lVar3) != *(long **)((long)local_418 + lVar3)) {
      operator_delete(*(long **)((long)local_418 + lVar3),*(long *)((long)local_408 + lVar3) + 1);
    }
    lVar3 = lVar3 + -0x88;
  } while (lVar3 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb28);
  if (local_418[0] != local_408) {
    operator_delete(local_418[0],local_408[0] + 1);
  }
  if (local_3f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)ppRVar2) {
    operator_delete(local_3f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_3f8.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffb48);
  if (local_3d8[0] != local_3c8) {
    operator_delete(local_3d8[0],local_3c8[0] + 1);
  }
  if (local_3b8[0] != local_3a8) {
    operator_delete(local_3b8[0],local_3a8[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffb88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_opts.oneline_description._M_dataplus._M_p !=
      &local_180.m_opts.oneline_description.field_2) {
    operator_delete(local_180.m_opts.oneline_description._M_dataplus._M_p,
                    local_180.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_description._M_dataplus._M_p != &local_180.m_description.field_2) {
    operator_delete(local_180.m_description._M_dataplus._M_p,
                    local_180.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_180.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_180.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_names._M_dataplus._M_p != &local_180.m_names.field_2) {
    operator_delete(local_180.m_names._M_dataplus._M_p,
                    local_180.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_260);
  if (local_280 != &local_270) {
    operator_delete(local_280,CONCAT71(uStack_26f,local_270) + 1);
  }
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_200._M_first);
  if (local_220 != &local_210) {
    operator_delete(local_220,CONCAT44(uStack_20c,local_210) + 1);
  }
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static RPCHelpMan help()
{
    return RPCHelpMan{"help",
                "\nList all commands, or get help for a specified command.\n",
                {
                    {"command", RPCArg::Type::STR, RPCArg::DefaultHint{"all commands"}, "The command to get help on"},
                },
                {
                    RPCResult{RPCResult::Type::STR, "", "The help text"},
                    RPCResult{RPCResult::Type::ANY, "", ""},
                },
                RPCExamples{""},
        [&](const RPCHelpMan& self, const JSONRPCRequest& jsonRequest) -> UniValue
{
    std::string strCommand;
    if (jsonRequest.params.size() > 0) {
        strCommand = jsonRequest.params[0].get_str();
    }
    if (strCommand == "dump_all_command_conversions") {
        // Used for testing only, undocumented
        return tableRPC.dumpArgMap(jsonRequest);
    }

    return tableRPC.help(strCommand, jsonRequest);
},
    };
}